

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

c_int init_linsys_solver_qdldl
                (qdldl_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  undefined4 *puVar1;
  c_int *PtoKKT;
  void *pvVar2;
  csc *Anz;
  qdldl_solver *in_RCX;
  csc *in_RDX;
  long in_RSI;
  csc *in_RDI;
  c_int *in_R8;
  qdldl_solver *in_XMM0_Qa;
  c_int **in_stack_00000010;
  c_int *in_stack_00000018;
  qdldl_solver *s;
  c_int n_plus_m;
  c_int i;
  csc *KKT_temp;
  long lVar3;
  csc *in_stack_fffffffffffffff8;
  c_int cVar4;
  
  puVar1 = (undefined4 *)calloc(1,0xe0);
  in_RDI->nzmax = (c_int)puVar1;
  *(undefined8 *)(puVar1 + 0x1c) = *(undefined8 *)(in_RSI + 0x10);
  *(c_int *)(puVar1 + 0x1e) = in_RDX->m;
  PtoKKT = (c_int *)(*(long *)(puVar1 + 0x1c) + *(long *)(puVar1 + 0x1e));
  *(qdldl_solver **)(puVar1 + 0x18) = in_XMM0_Qa;
  *(c_int **)(puVar1 + 0x1a) = in_R8;
  *(code **)(puVar1 + 2) = solve_linsys_qdldl;
  *(code **)(puVar1 + 4) = free_linsys_solver_qdldl;
  *(code **)(puVar1 + 6) = update_linsys_solver_matrices_qdldl;
  *(code **)(puVar1 + 8) = update_linsys_solver_rho_vec_qdldl;
  *puVar1 = 0;
  *(undefined8 *)(puVar1 + 10) = 1;
  pvVar2 = malloc(0x38);
  *(void **)(puVar1 + 0xc) = pvVar2;
  *(c_int **)(*(long *)(puVar1 + 0xc) + 8) = PtoKKT;
  *(c_int **)(*(long *)(puVar1 + 0xc) + 0x10) = PtoKKT;
  *(undefined8 *)(*(long *)(puVar1 + 0xc) + 0x30) = 0xffffffffffffffff;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0xe) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x2c) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x10) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x12) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x14) = pvVar2;
  pvVar2 = malloc(*(long *)(puVar1 + 0x1e) << 3);
  *(void **)(puVar1 + 0x16) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x2e) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x30) = pvVar2;
  pvVar2 = malloc(((long)PtoKKT + 1U) * 8);
  *(void **)(*(long *)(puVar1 + 0xc) + 0x18) = pvVar2;
  *(undefined8 *)(*(long *)(puVar1 + 0xc) + 0x20) = 0;
  *(undefined8 *)(*(long *)(puVar1 + 0xc) + 0x28) = 0;
  pvVar2 = malloc((long)PtoKKT * 0x18);
  *(void **)(puVar1 + 0x32) = pvVar2;
  pvVar2 = malloc((size_t)PtoKKT);
  *(void **)(puVar1 + 0x34) = pvVar2;
  pvVar2 = malloc((long)PtoKKT << 3);
  *(void **)(puVar1 + 0x36) = pvVar2;
  if (in_R8 == (c_int *)0x0) {
    pvVar2 = malloc(*(long *)(*(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x10) * 8) << 3);
    *(void **)(puVar1 + 0x26) = pvVar2;
    pvVar2 = malloc(in_RDX->p[in_RDX->n] << 3);
    *(void **)(puVar1 + 0x28) = pvVar2;
    pvVar2 = malloc(in_RDX->m << 3);
    *(void **)(puVar1 + 0x2a) = pvVar2;
    for (lVar3 = 0; lVar3 < in_RDX->m; lVar3 = lVar3 + 1) {
      *(double *)(*(long *)(puVar1 + 0x16) + lVar3 * 8) =
           1.0 / *(double *)(&in_RCX->type + lVar3 * 2);
    }
    Anz = form_KKT(in_stack_fffffffffffffff8,in_RDI,in_RSI,(c_float)in_RDX,(c_float *)in_XMM0_Qa,
                   (c_int *)in_RCX,in_R8,in_stack_00000010,in_stack_00000018,(c_int *)s);
    if (Anz != (csc *)0x0) {
      permute_KKT((csc **)in_XMM0_Qa,in_RCX,(c_int)in_R8,(c_int)Anz,lVar3,PtoKKT,&in_RDI->nzmax,
                  &in_stack_fffffffffffffff8->nzmax);
    }
  }
  else {
    for (lVar3 = 0; lVar3 < in_RDX->m; lVar3 = lVar3 + 1) {
      *(qdldl_solver **)(*(long *)(puVar1 + 0x16) + lVar3 * 8) = in_XMM0_Qa;
    }
    Anz = form_KKT(in_stack_fffffffffffffff8,in_RDI,in_RSI,(c_float)in_RDX,(c_float *)in_XMM0_Qa,
                   (c_int *)in_RCX,in_R8,in_stack_00000010,in_stack_00000018,(c_int *)s);
    if (Anz != (csc *)0x0) {
      permute_KKT((csc **)in_XMM0_Qa,in_RCX,(c_int)in_R8,(c_int)Anz,lVar3,PtoKKT,&in_RDI->nzmax,
                  &in_stack_fffffffffffffff8->nzmax);
    }
  }
  if (Anz == (csc *)0x0) {
    printf("ERROR in %s: ","init_linsys_solver_qdldl");
    printf("Error forming and permuting KKT matrix");
    printf("\n");
    free_linsys_solver_qdldl((qdldl_solver *)0x10b5e7);
    in_RDI->nzmax = 0;
    cVar4 = 4;
  }
  else {
    cVar4 = LDL_factor(in_RDX,in_XMM0_Qa,(c_int)in_RCX);
    if (cVar4 < 0) {
      csc_spfree((csc *)0x10b626);
      free_linsys_solver_qdldl((qdldl_solver *)0x10b630);
      in_RDI->nzmax = 0;
      cVar4 = 5;
    }
    else {
      if (in_R8 == (c_int *)0x0) {
        *(csc **)(puVar1 + 0x24) = Anz;
      }
      else {
        csc_spfree((csc *)0x10b659);
      }
      cVar4 = 0;
    }
  }
  return cVar4;
}

Assistant:

c_int init_linsys_solver_qdldl(qdldl_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){

    // Define Variables
    csc * KKT_temp;     // Temporary KKT pointer
    c_int i;            // Loop counter
    c_int n_plus_m;     // Define n_plus_m dimension

    // Allocate private structure to store KKT factorization
    qdldl_solver *s;
    s = c_calloc(1, sizeof(qdldl_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_qdldl;

#ifndef EMBEDDED
    s->free = &free_linsys_solver_qdldl;
#endif

#if EMBEDDED != 1
    s->update_matrices = &update_linsys_solver_matrices_qdldl;
    s->update_rho_vec = &update_linsys_solver_rho_vec_qdldl;
#endif

    // Assign type
    s->type = QDLDL_SOLVER;

    // Set number of threads to 1 (single threaded)
    s->nthreads = 1;

    // Sparse matrix L (lower triangular)
    // NB: We don not allocate L completely (CSC elements)
    //      L will be allocated during the factorization depending on the
    //      resulting number of elements.
    s->L = c_malloc(sizeof(csc));
    s->L->m = n_plus_m;
    s->L->n = n_plus_m;
    s->L->nz = -1;

    // Diagonal matrix stored as a vector D
    s->Dinv = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);
    s->D    = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Permutation vector P
    s->P    = (QDLDL_int *)c_malloc(sizeof(QDLDL_int) * n_plus_m);

    // Working vector
    s->bp   = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Solution vector
    s->sol  = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * s->m);

    // Elimination tree workspace
    s->etree = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));
    s->Lnz   = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));

    // Preallocate L matrix (Lx and Li are sparsity dependent)
    s->L->p = (c_int *)c_malloc((n_plus_m+1) * sizeof(QDLDL_int));

    // Lx and Li are sparsity dependent, so set them to
    // null initially so we don't try to free them prematurely
    s->L->i = OSQP_NULL;
    s->L->x = OSQP_NULL;

    // Preallocate workspace
    s->iwork = (QDLDL_int *)c_malloc(sizeof(QDLDL_int)*(3*n_plus_m));
    s->bwork = (QDLDL_bool *)c_malloc(sizeof(QDLDL_bool)*n_plus_m);
    s->fwork = (QDLDL_float *)c_malloc(sizeof(QDLDL_float)*n_plus_m);

    // Form and permute KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use p->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec,
                            s->PtoKKT, s->AtoKKT,
                            &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, P->p[P->n], A->p[A->n], A->m, s->PtoKKT, s->AtoKKT, s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!KKT_temp){
#ifdef PRINTING
        c_eprint("Error forming and permuting KKT matrix");
#endif
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Factorize the KKT matrix
    if (LDL_factor(KKT_temp, s, P->n) < 0) {
        csc_spfree(KKT_temp);
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_NONCVX_ERROR;
    }

    if (polish){ // If KKT passed, assign it to KKT_temp
        // Polish, no need for KKT_temp
        csc_spfree(KKT_temp);
    }
    else { // If not embedded option 1 copy pointer to KKT_temp. Do not free it.
        s->KKT = KKT_temp;
    }


    // No error
    return 0;
}